

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

double nearestPowerOfTwoScale(double value)

{
  double in_XMM0_Qa;
  double dVar1;
  __type_conflict _Var2;
  double scale;
  double check_value;
  double check_x;
  int exp_scale;
  int local_c [3];
  
  dVar1 = frexp(in_XMM0_Qa,local_c);
  if ((ABS(dVar1) == 0.5) && (!NAN(ABS(dVar1)))) {
    local_c[0] = local_c[0] + -1;
  }
  std::pow<int,int>(0,0x7f4a8a);
  local_c[0] = -local_c[0];
  _Var2 = std::ldexp<int>(0,0x7f4ab5);
  return _Var2;
}

Assistant:

double nearestPowerOfTwoScale(const double value) {
  int exp_scale;
  // Decompose value into a normalized fraction and an integral power
  // of two.
  //
  // If arg is zero, returns zero and stores zero in *exp. Otherwise
  // (if arg is not zero), if no errors occur, returns the value x in
  // the range (-1;-0.5], [0.5; 1) and stores an integer value in *exp
  // such that x×2(*exp)=arg
  double check_x = std::frexp(value, &exp_scale);
  if (std::fabs(check_x) == 0.5) {
    check_x *= 2;
    exp_scale--;
  }
  const double check_value = check_x * std::pow(2, exp_scale);
  assert(check_value == value);
  exp_scale = -exp_scale;
  // Multiply a floating point value x(=1) by the number 2 raised to
  // the exp power
  double scale = std::ldexp(1, exp_scale);
  return scale;
}